

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O2

sc_signed * sc_dt::operator|(sc_signed *__return_storage_ptr__,sc_signed *u,unsigned_long v)

{
  sc_digit vd [3];
  
  if (v == 0) {
    sc_signed::sc_signed(__return_storage_ptr__,u);
  }
  else {
    from_uint<unsigned_long>(3,vd,v);
    if (u->sgn == 0) {
      sc_signed::sc_signed(__return_storage_ptr__,1,0x40,3,vd,false);
    }
    else {
      or_signed_friend(__return_storage_ptr__,u->sgn,u->nbits,u->ndigits,u->digit,1,0x40,3,vd);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator|(const sc_signed& u, unsigned long v)
{

  if (v == 0)  // case 1
    return sc_signed(u);

  CONVERT_LONG(v);

  if (u.sgn == SC_ZERO)  // case 2
    return sc_signed(vs, BITS_PER_ULONG, DIGITS_PER_ULONG, vd, false);

  // other cases
  return or_signed_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                          vs, BITS_PER_ULONG, DIGITS_PER_ULONG, vd);

}